

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadAnimation(OgreBinarySerializer *this,Animation *anim)

{
  bool bVar1;
  uint16_t uVar2;
  float fVar3;
  undefined1 local_b0 [8];
  VertexAnimationTrack track;
  uint16_t local_1a;
  uint16_t id;
  Animation *anim_local;
  OgreBinarySerializer *this_local;
  
  bVar1 = AtEnd(this);
  if (!bVar1) {
    local_1a = ReadHeader(this,true);
    if (local_1a == 0xd105) {
      ReadLine_abi_cxx11_((string *)
                          &track.transformKeyFrames.
                           super__Vector_base<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,this);
      std::__cxx11::string::operator=
                ((string *)&anim->baseName,
                 (string *)
                 &track.transformKeyFrames.
                  super__Vector_base<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &track.transformKeyFrames.
                  super__Vector_base<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      fVar3 = Read<float>(this);
      anim->baseTime = fVar3;
      local_1a = ReadHeader(this,true);
    }
    while (bVar1 = AtEnd(this), !bVar1 && local_1a == 0xd110) {
      VertexAnimationTrack::VertexAnimationTrack((VertexAnimationTrack *)local_b0);
      uVar2 = Read<unsigned_short>(this);
      local_b0._0_4_ = ZEXT24(uVar2);
      local_b0._4_2_ = Read<unsigned_short>(this);
      ReadAnimationKeyFrames(this,anim,(VertexAnimationTrack *)local_b0);
      std::
      vector<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
      ::push_back(&anim->tracks,(value_type *)local_b0);
      bVar1 = AtEnd(this);
      if (!bVar1) {
        local_1a = ReadHeader(this,true);
      }
      VertexAnimationTrack::~VertexAnimationTrack((VertexAnimationTrack *)local_b0);
    }
    bVar1 = AtEnd(this);
    if (!bVar1) {
      RollbackHeader(this);
    }
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadAnimation(Animation *anim)
{
    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        if (id == M_ANIMATION_BASEINFO)
        {
            anim->baseName = ReadLine();
            anim->baseTime = Read<float>();

            // Advance to first track
            id = ReadHeader();
        }

        while (!AtEnd() && id == M_ANIMATION_TRACK)
        {
            VertexAnimationTrack track;
            track.type = static_cast<VertexAnimationTrack::Type>(Read<uint16_t>());
            track.target = Read<uint16_t>();

            ReadAnimationKeyFrames(anim, &track);

            anim->tracks.push_back(track);

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}